

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::
PerformDefaultAction
          (FunctionMocker<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  string message;
  long *local_58 [2];
  long local_48 [2];
  ArgumentTuple local_38;
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar1 = (call_description->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar1,pcVar1 + call_description->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      if (local_58[0] == local_48) {
        return;
      }
      operator_delete(local_58[0],local_48[0] + 1);
      return;
    }
    this_00 = (OnCallSpec<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::Matches
                      (this_00,args);
  } while (!bVar2);
  this_01 = OnCallSpec<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::GetAction
                      (this_00);
  local_38.super__Tuple_impl<0UL,_pstore::gsl::not_null<const_void_*>,_unsigned_long>.
  super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)
       (args->super__Tuple_impl<0UL,_pstore::gsl::not_null<const_void_*>,_unsigned_long>).
       super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
       _M_head_impl;
  local_38.super__Tuple_impl<0UL,_pstore::gsl::not_null<const_void_*>,_unsigned_long>.
  super__Head_base<0UL,_pstore::gsl::not_null<const_void_*>,_false>._M_head_impl.ptr_ =
       (not_null<const_void_*>)
       (args->super__Tuple_impl<0UL,_pstore::gsl::not_null<const_void_*>,_unsigned_long>).
       super__Head_base<0UL,_pstore::gsl::not_null<const_void_*>,_false>._M_head_impl.ptr_;
  Action<void_(pstore::gsl::not_null<const_void_*>,_unsigned_long)>::Perform(this_01,&local_38);
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }